

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void countnz(int n,int_t *xprune,int_t *nnzL,int_t *nnzU,GlobalLU_t *Glu)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int_t *piVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  piVar3 = Glu->xsup;
  piVar4 = Glu->xlsub;
  *nnzL = 0;
  *nnzU = Glu->xusub[n];
  uVar1 = Glu->supno[n];
  if (-1 < (int)uVar1 && 0 < n) {
    lVar6 = 0;
    do {
      iVar2 = piVar3[lVar6];
      lVar7 = lVar6 + 1;
      if (iVar2 < piVar3[lVar6 + 1]) {
        iVar8 = piVar4[(long)iVar2 + 1] - piVar4[iVar2];
        iVar9 = 1;
        do {
          *nnzL = *nnzL + iVar8;
          *nnzU = *nnzU + iVar9;
          iVar8 = iVar8 + -1;
          iVar5 = iVar2 + iVar9;
          iVar9 = iVar9 + 1;
        } while (iVar5 < piVar3[lVar7]);
      }
      lVar6 = lVar7;
    } while (lVar7 != (ulong)uVar1 + 1);
  }
  return;
}

Assistant:

void
countnz(const int n, int_t *xprune, int_t *nnzL, int_t *nnzU, GlobalLU_t *Glu)
{
    int          nsuper, fsupc, i, j;
    int_t        jlen;
#if ( DEBUGlevel>=1 )
    int_t        irep = 0, nnzL0 = 0;
#endif
    int          *xsup;
    int_t        *xlsub;

    xsup   = Glu->xsup;
    xlsub  = Glu->xlsub;
    *nnzL  = 0;
    *nnzU  = (Glu->xusub)[n];
    nsuper = (Glu->supno)[n];

    if ( n <= 0 ) return;

    /* 
     * For each supernode
     */
    for (i = 0; i <= nsuper; i++) {
	fsupc = xsup[i];
	jlen = xlsub[fsupc+1] - xlsub[fsupc];

	for (j = fsupc; j < xsup[i+1]; j++) {
	    *nnzL += jlen;
	    *nnzU += j - fsupc + 1;
	    jlen--;
	}
#if ( DEBUGlevel>=1 )
        irep = xsup[i+1] - 1;
        nnzL0 += xprune[irep] - xlsub[irep];
#endif
    }

#if ( DEBUGlevel>=1 )
    printf("\tNo of nonzeros in symm-reduced L = %lld\n", (long long) nnzL0); fflush(stdout);
#endif
}